

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeSyncI(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint RC;
  uint32_t RegNo;
  uint Reg;
  MCRegisterInfo *in_RCX;
  uint in_ESI;
  MCInst *in_RDI;
  uint Base;
  int Offset;
  
  RC = SignExtend32(in_ESI & 0xffff,0x10);
  RegNo = fieldFromInstruction(in_ESI,0x15,5);
  Reg = getReg(in_RCX,RC,RegNo);
  MCOperand_CreateReg0(in_RDI,Reg);
  MCOperand_CreateImm0(in_RDI,(long)(int)RC);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeSyncI(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}